

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O0

void nni_msgq_aio_put(nni_msgq *mq,nni_aio *aio)

{
  _Bool _Var1;
  nni_aio *aio_local;
  nni_msgq *mq_local;
  
  nni_mtx_lock(&mq->mq_lock);
  _Var1 = nni_aio_start(aio,nni_msgq_cancel,mq);
  if (_Var1) {
    nni_aio_list_append(&mq->mq_aio_putq,aio);
    nni_msgq_run_putq(mq);
    nni_msgq_run_notify(mq);
    nni_mtx_unlock(&mq->mq_lock);
  }
  else {
    nni_mtx_unlock(&mq->mq_lock);
  }
  return;
}

Assistant:

void
nni_msgq_aio_put(nni_msgq *mq, nni_aio *aio)
{
	nni_mtx_lock(&mq->mq_lock);

	// If this is an instantaneous poll operation, and the queue has
	// no room, nobody is waiting to receive, then report NNG_ETIMEDOUT.
	if (!nni_aio_start(aio, nni_msgq_cancel, mq)) {
		nni_mtx_unlock(&mq->mq_lock);
		return;
	}
	nni_aio_list_append(&mq->mq_aio_putq, aio);
	nni_msgq_run_putq(mq);
	nni_msgq_run_notify(mq);

	nni_mtx_unlock(&mq->mq_lock);
}